

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O0

void Map_MappingSetRefs_rec(Map_Man_t *pMan,Map_Node_t *pNode)

{
  uint uVar1;
  int iVar2;
  Map_Node_t *p;
  uint local_34;
  int fInvPin;
  int fPhase;
  int i;
  uint uPhase;
  Map_Node_t *pNodeR;
  Map_Cut_t *pCut;
  Map_Node_t *pNode_local;
  Map_Man_t *pMan_local;
  
  p = (Map_Node_t *)((ulong)pNode & 0xfffffffffffffffe);
  local_34 = (uint)((((ulong)pNode & 1) != 0 ^ 0xffU) & 1);
  p->nRefAct[2] = p->nRefAct[2] + 1;
  iVar2 = p->nRefAct[(int)local_34];
  p->nRefAct[(int)local_34] = iVar2 + 1;
  if ((iVar2 == 0) && (iVar2 = Map_NodeIsVar(p), iVar2 == 0)) {
    iVar2 = Map_NodeIsBuf(p);
    if (iVar2 == 0) {
      iVar2 = Map_NodeIsAnd(pNode);
      if (iVar2 == 0) {
        __assert_fail("Map_NodeIsAnd(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperRefs.c"
                      ,0x1b0,"void Map_MappingSetRefs_rec(Map_Man_t *, Map_Node_t *)");
      }
      pNodeR = (Map_Node_t *)p->pCutBest[(int)local_34];
      if (pNodeR == (Map_Node_t *)0x0) {
        local_34 = (uint)((local_34 != 0 ^ 0xffU) & 1);
        pNodeR = (Map_Node_t *)p->pCutBest[(int)local_34];
      }
      if (pMan->fUseProfile != 0) {
        Mio_GateIncProfile2(*(Mio_Gate_t **)
                             (*(long *)((long)pNodeR->tArrival + (long)(int)local_34 * 0x28) + 0x40)
                           );
      }
      uVar1 = *(uint *)((long)pNodeR->tArrival + (long)(int)local_34 * 0x28 + -4);
      for (fInvPin = 0; fInvPin < *(char *)((long)&pNodeR->p2 + 4); fInvPin = fInvPin + 1) {
        Map_MappingSetRefs_rec
                  (pMan,(Map_Node_t *)
                        (*(ulong *)(pNodeR->nRefAct + (long)fInvPin * 2 + -2) ^
                        (long)(int)(uint)((uVar1 & 1 << ((byte)fInvPin & 0x1f)) != 0)));
      }
    }
    else {
      Map_MappingSetRefs_rec(pMan,(Map_Node_t *)((ulong)p->p1 ^ (long)(int)((uint)pNode & 1)));
    }
  }
  return;
}

Assistant:

void Map_MappingSetRefs_rec( Map_Man_t * pMan, Map_Node_t * pNode )
{
    Map_Cut_t * pCut;
    Map_Node_t * pNodeR;
    unsigned uPhase;
    int i, fPhase, fInvPin;
    // get the regular node and its phase
    pNodeR = Map_Regular(pNode);
    fPhase = !Map_IsComplement(pNode);
    pNodeR->nRefAct[2]++;
    // quit if the node was already visited in this phase
    if ( pNodeR->nRefAct[fPhase]++ )
        return;
    // quit if this is a PI node
    if ( Map_NodeIsVar(pNodeR) )
        return;
    // propagate through buffer
    if ( Map_NodeIsBuf(pNodeR) )
    {
        Map_MappingSetRefs_rec( pMan, Map_NotCond(pNodeR->p1, Map_IsComplement(pNode)) );
        return;
    }
    assert( Map_NodeIsAnd(pNode) );
    // get the cut implementing this or opposite polarity
    pCut = pNodeR->pCutBest[fPhase];
    if ( pCut == NULL )
    {
        fPhase = !fPhase;
        pCut   = pNodeR->pCutBest[fPhase];
    }
    if ( pMan->fUseProfile )
        Mio_GateIncProfile2( pCut->M[fPhase].pSuperBest->pRoot );
    // visit the transitive fanin
    uPhase = pCut->M[fPhase].uPhaseBest;
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        fInvPin = ((uPhase & (1 << i)) > 0);
        Map_MappingSetRefs_rec( pMan, Map_NotCond(pCut->ppLeaves[i], fInvPin) );
    }
}